

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::DefinitionSymbol::DefinitionSymbol
          (DefinitionSymbol *this,Scope *scope,LookupLocation lookupLocation,
          ModuleDeclarationSyntax *syntax,NetType *defaultNetType,UnconnectedDrive unconnectedDrive,
          bool cellDefine,optional<slang::TimeScale> directiveTimeScale,SyntaxTree *syntaxTree)

{
  SmallVector<slang::ast::DefinitionSymbol::ParameterDecl,_8UL> *results;
  flat_hash_set<std::string_view> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  SyntaxKind SVar3;
  PortListSyntax *pPVar4;
  ParameterPortListSyntax *syntax_00;
  size_t sVar5;
  TimeUnitsDeclarationSyntax *syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  Token token;
  byte bVar6;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  optional<slang::SourceRange> unitsRange_00;
  optional<slang::SourceRange> precisionRange_00;
  char *__s1;
  DefinitionSymbol *pDVar7;
  value_type_pointer pbVar8;
  DefinitionKind DVar9;
  int iVar10;
  uint uVar11;
  SourceLocation SVar12;
  optional<slang::ast::VariableLifetime> oVar13;
  SyntaxNode *pSVar14;
  Diagnostic *this_00;
  byte *pbVar15;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar16;
  _Storage<slang::ast::VariableLifetime,_true> _Var17;
  SourceLibrary *pSVar18;
  ModuleHeaderSyntax *pMVar19;
  pointer ppMVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  pointer ppMVar24;
  size_type __rlen;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  byte bVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  byte bVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  byte bVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  byte bVar43;
  string_view sVar44;
  SourceRange sourceRange;
  size_t pos;
  value_type *elements;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  locator res;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe90;
  string_view local_118;
  TimeScale *local_108;
  uint64_t local_100;
  DefinitionSymbol *local_f8;
  ulong local_f0;
  undefined4 local_e8;
  uchar uStack_e4;
  uchar uStack_e3;
  uchar uStack_e2;
  byte bStack_e1;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  byte bStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  ParameterPortListSyntax *local_d8;
  size_t local_d0;
  pointer local_c8;
  ulong local_c0;
  TimeUnitsDeclarationSyntax *local_b8;
  ulong local_b0;
  ulong local_a8;
  group_type_pointer local_a0;
  value_type_pointer local_98;
  ulong local_90;
  _Storage<slang::SourceRange,_true> local_88;
  undefined1 local_78;
  undefined7 uStack_77;
  _Storage<slang::SourceRange,_true> local_70;
  undefined1 local_60;
  undefined7 uStack_5f;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_e8 = lookupLocation.index;
  sVar44 = parsing::Token::valueText(&((syntax->header).ptr)->name);
  SVar12 = parsing::Token::location(&((syntax->header).ptr)->name);
  (this->super_Symbol).kind = Definition;
  (this->super_Symbol).name = sVar44;
  (this->super_Symbol).location = SVar12;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  this->defaultNetType = defaultNetType;
  this->unconnectedDrive = unconnectedDrive;
  this->cellDefine = cellDefine;
  (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.data_ =
       (pointer)(this->parameters).
                super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.firstElement;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len = 0;
  (this->parameters).super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.cap = 8;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_size_mask = 1;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->bindDirectives).
  super__Vector_base<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bindDirectives).
  super__Vector_base<slang::ast::BindDirectiveInfo,_std::allocator<slang::ast::BindDirectiveInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.ml = 0;
  (this->modports).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
  .size_ctrl.size = 0;
  this->syntaxTree = syntaxTree;
  if ((syntaxTree == (SyntaxTree *)0x0) ||
     (pSVar18 = syntaxTree->library, pSVar18 == (SourceLibrary *)0x0)) {
    pSVar18 = scope->compilation->defaultLibPtr;
  }
  results = &this->parameters;
  this->sourceLibrary = pSVar18;
  this->instanceCount = 0;
  (this->super_Symbol).parentScope = scope;
  (this->super_Symbol).indexInScope = local_e8;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_02._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_02._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_02);
  DVar9 = SemanticFacts::getDefinitionKind((syntax->super_MemberSyntax).super_SyntaxNode.kind);
  this->definitionKind = DVar9;
  pMVar19 = (syntax->header).ptr;
  token.kind = (pMVar19->lifetime).kind;
  token._2_1_ = (pMVar19->lifetime).field_0x2;
  token.numFlags.raw = (pMVar19->lifetime).numFlags.raw;
  token.rawLen = (pMVar19->lifetime).rawLen;
  token.info = (pMVar19->lifetime).info;
  oVar13 = SemanticFacts::getVariableLifetime(token);
  _Var17._M_value = Static;
  if (((ulong)oVar13.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::VariableLifetime> >> 0x20 & 1) != 0) {
    _Var17._M_value =
         oVar13.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::VariableLifetime>._M_payload;
  }
  this->defaultLifetime = (VariableLifetime)_Var17;
  pMVar19 = (syntax->header).ptr;
  if ((pMVar19->ports != (PortListSyntax *)0x0) &&
     ((pMVar19->ports->super_SyntaxNode).kind == WildcardPortList)) {
    pSVar14 = Compilation::getExternDefinition(scope->compilation,(this->super_Symbol).name,scope);
    if ((pSVar14 == (SyntaxNode *)0x0) || (pSVar14->kind != ExternModuleDecl)) {
      if ((this->super_Symbol).name._M_len != 0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(&pMVar19->ports->super_SyntaxNode);
        this_00 = Scope::addDiag(scope,(DiagCode)0x7d0006,sourceRange);
        Diagnostic::operator<<(this_00,(this->super_Symbol).name);
      }
    }
    else {
      pMVar19 = (ModuleHeaderSyntax *)pSVar14[6].parent;
    }
  }
  pPVar4 = pMVar19->ports;
  this->portList = pPVar4;
  if (pPVar4 == (PortListSyntax *)0x0) {
    bVar25 = false;
  }
  else {
    bVar25 = (pPVar4->super_SyntaxNode).kind == NonAnsiPortList;
  }
  this->hasNonAnsiPorts = bVar25;
  syntax_00 = pMVar19->parameters;
  if (syntax_00 != (ParameterPortListSyntax *)0x0) {
    ParameterBuilder::createDecls
              (scope,syntax_00,
               &results->super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>);
  }
  local_108 = (TimeScale *)&this->timeScale;
  local_60 = 0;
  local_78 = 0;
  sVar5 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  local_d8 = syntax_00;
  if (sVar5 != 0) {
    arrays_ = &this->modports;
    ppMVar20 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
               _M_ptr;
    ppMVar24 = ppMVar20 + sVar5;
    bVar25 = true;
    local_f8 = this;
    local_c8 = ppMVar24;
    do {
      syntax_01 = (TimeUnitsDeclarationSyntax *)*ppMVar20;
      SVar3 = (syntax_01->super_MemberSyntax).super_SyntaxNode.kind;
      if (SVar3 == ModportDeclaration) {
        pbVar15 = (byte *)((long)&(syntax_01[1].super_MemberSyntax.super_SyntaxNode.parent)->kind +
                          1);
        if (pbVar15 < (byte *)0x2) {
LAB_004428f9:
          bVar25 = false;
        }
        else {
          local_c0 = (ulong)pbVar15 >> 1;
          uVar21 = 0;
          local_b8 = syntax_01;
          do {
            ppSVar16 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)(uVar21 * 0x30 +
                                     *(long *)&local_b8[1].super_MemberSyntax.super_SyntaxNode));
            local_90 = uVar21;
            local_118 = parsing::Token::valueText((Token *)(*ppSVar16 + 1));
            local_100 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                        operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)arrays_,&local_118);
            uVar21 = local_100 >>
                     ((byte)(this->modports).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.groups_size_index & 0x3f);
            local_a0 = (this->modports).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.groups_;
            lVar22 = (local_100 & 0xff) * 4;
            uVar28 = (&UNK_0047072c)[lVar22];
            uVar29 = (&UNK_0047072d)[lVar22];
            uVar30 = (&UNK_0047072e)[lVar22];
            bVar31 = (&UNK_0047072f)[lVar22];
            local_98 = (this->modports).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.elements_;
            sVar5 = local_118._M_len;
            __s1 = local_118._M_str;
            local_a8 = (ulong)((uint)local_100 & 7);
            local_d0 = (this->modports).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                       .arrays.groups_size_mask;
            uVar23 = 0;
            uVar32 = uVar28;
            uVar33 = uVar29;
            uVar34 = uVar30;
            bVar35 = bVar31;
            uVar36 = uVar28;
            uVar37 = uVar29;
            uVar38 = uVar30;
            bVar39 = bVar31;
            uVar40 = uVar28;
            uVar41 = uVar29;
            uVar42 = uVar30;
            bVar43 = bVar31;
            local_b0 = uVar21;
            do {
              pbVar8 = local_98;
              pgVar2 = local_a0 + uVar21;
              local_58 = pgVar2->m[0].n;
              uStack_57 = pgVar2->m[1].n;
              uStack_56 = pgVar2->m[2].n;
              bStack_55 = pgVar2->m[3].n;
              uStack_54 = pgVar2->m[4].n;
              uStack_53 = pgVar2->m[5].n;
              uStack_52 = pgVar2->m[6].n;
              bStack_51 = pgVar2->m[7].n;
              uStack_50 = pgVar2->m[8].n;
              uStack_4f = pgVar2->m[9].n;
              uStack_4e = pgVar2->m[10].n;
              bStack_4d = pgVar2->m[0xb].n;
              uStack_4c = pgVar2->m[0xc].n;
              uStack_4b = pgVar2->m[0xd].n;
              uStack_4a = pgVar2->m[0xe].n;
              bVar6 = pgVar2->m[0xf].n;
              auVar27[0] = -(local_58 == uVar28);
              auVar27[1] = -(uStack_57 == uVar29);
              auVar27[2] = -(uStack_56 == uVar30);
              auVar27[3] = -(bStack_55 == bVar31);
              auVar27[4] = -(uStack_54 == uVar32);
              auVar27[5] = -(uStack_53 == uVar33);
              auVar27[6] = -(uStack_52 == uVar34);
              auVar27[7] = -(bStack_51 == bVar35);
              auVar27[8] = -(uStack_50 == uVar36);
              auVar27[9] = -(uStack_4f == uVar37);
              auVar27[10] = -(uStack_4e == uVar38);
              auVar27[0xb] = -(bStack_4d == bVar39);
              auVar27[0xc] = -(uStack_4c == uVar40);
              auVar27[0xd] = -(uStack_4b == uVar41);
              auVar27[0xe] = -(uStack_4a == uVar42);
              auVar27[0xf] = -(bVar6 == bVar43);
              uVar11 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
              local_f0 = uVar21;
              bStack_49 = bVar6;
              if (uVar11 != 0) {
                local_e8 = CONCAT13(bVar31,CONCAT12(uVar30,CONCAT11(uVar29,uVar28)));
                uStack_e4 = uVar32;
                uStack_e3 = uVar33;
                uStack_e2 = uVar34;
                bStack_e1 = bVar35;
                uStack_e0 = uVar36;
                uStack_df = uVar37;
                uStack_de = uVar38;
                bStack_dd = bVar39;
                uStack_dc = uVar40;
                uStack_db = uVar41;
                uStack_da = uVar42;
                bStack_d9 = bVar43;
                do {
                  iVar10 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                    }
                  }
                  if (sVar5 == *(size_t *)
                                ((long)&pbVar8[uVar21 * 0xf]._M_len + (ulong)(uint)(iVar10 << 4))) {
                    if (sVar5 == 0) goto LAB_00442b07;
                    iVar10 = bcmp(__s1,*(void **)((long)&pbVar8[uVar21 * 0xf]._M_str +
                                                 (ulong)(uint)(iVar10 << 4)),sVar5);
                    uVar28 = (uchar)local_e8;
                    uVar29 = local_e8._1_1_;
                    uVar30 = local_e8._2_1_;
                    bVar31 = local_e8._3_1_;
                    uVar32 = uStack_e4;
                    uVar33 = uStack_e3;
                    uVar34 = uStack_e2;
                    bVar35 = bStack_e1;
                    uVar36 = uStack_e0;
                    uVar37 = uStack_df;
                    uVar38 = uStack_de;
                    bVar39 = bStack_dd;
                    uVar40 = uStack_dc;
                    uVar41 = uStack_db;
                    uVar42 = uStack_da;
                    bVar43 = bStack_d9;
                    if (iVar10 == 0) goto LAB_00442b07;
                  }
                  uVar11 = uVar11 - 1 & uVar11;
                } while (uVar11 != 0);
              }
              pDVar7 = local_f8;
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[local_a8] & bVar6) == 0) break;
              lVar22 = local_f0 + uVar23;
              uVar23 = uVar23 + 1;
              uVar21 = lVar22 + 1U & local_d0;
            } while (uVar23 <= local_d0);
            if ((local_f8->modports).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.size <
                (local_f8->modports).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.ml) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                        (&local_48,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)arrays_,(arrays_type *)arrays_,local_b0,local_100,&local_118);
              psVar1 = &(pDVar7->modports).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                        .size_ctrl.size;
              *psVar1 = *psVar1 + 1;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                        (&local_48,
                         (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                          *)arrays_,local_100,&local_118);
            }
LAB_00442b07:
            uVar21 = local_90 + 1;
            bVar25 = false;
            this = local_f8;
            ppMVar24 = local_c8;
          } while (uVar21 != local_c0);
        }
      }
      else if (SVar3 == ParameterDeclarationStatement) {
        bVar26 = true;
        if (local_d8 == (ParameterPortListSyntax *)0x0) {
          bVar26 = *(short *)&(*(Scope **)&syntax_01->keyword)->firstMember == 0xd2;
        }
        bVar25 = false;
        attributes._M_extent._M_extent_value = in_stack_fffffffffffffe90._M_extent_value;
        attributes._M_ptr = (pointer)results;
        ParameterBuilder::createDecls
                  ((ParameterBuilder *)scope,*(Scope **)&syntax_01->keyword,
                   (ParameterDeclarationBaseSyntax *)(ulong)bVar26,false,
                   SUB81((syntax_01->super_MemberSyntax).attributes.
                         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>
                         ._M_ptr,0),attributes,
                   (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)
                   (syntax_01->super_MemberSyntax).attributes.
                   super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                   _M_extent._M_extent_value);
      }
      else {
        if (SVar3 != TimeUnitsDeclaration) goto LAB_004428f9;
        if ((this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
          (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_payload =
               (_Storage<slang::TimeScale,_true>)0x1030103;
          (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
        }
        SemanticFacts::populateTimeScale
                  (local_108,scope,syntax_01,(optional<slang::SourceRange> *)&local_70._M_value,
                   (optional<slang::SourceRange> *)&local_88._M_value,bVar25);
      }
      ppMVar20 = ppMVar20 + 1;
    } while (ppMVar20 != ppMVar24);
  }
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_77;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = (bool)local_78;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_5f;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = (bool)local_60;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       local_70._M_value.endLoc;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       local_70._M_value.startLoc;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       local_88._M_value.endLoc;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       local_88._M_value.startLoc;
  SemanticFacts::populateTimeScale
            ((optional<slang::TimeScale> *)local_108,scope,directiveTimeScale,unitsRange_00,
             precisionRange_00);
  return;
}

Assistant:

DefinitionSymbol::DefinitionSymbol(const Scope& scope, LookupLocation lookupLocation,
                                   const ModuleDeclarationSyntax& syntax,
                                   const NetType& defaultNetType, UnconnectedDrive unconnectedDrive,
                                   bool cellDefine, std::optional<TimeScale> directiveTimeScale,
                                   const SyntaxTree* syntaxTree) :
    Symbol(SymbolKind::Definition, syntax.header->name.valueText(), syntax.header->name.location()),
    defaultNetType(defaultNetType), unconnectedDrive(unconnectedDrive), cellDefine(cellDefine),
    syntaxTree(syntaxTree), sourceLibrary(getLibForDef(scope, syntaxTree)) {

    // Extract and save various properties of the definition.
    setParent(scope, lookupLocation.getIndex());
    setSyntax(syntax);
    setAttributes(scope, syntax.attributes);

    definitionKind = SemanticFacts::getDefinitionKind(syntax.kind);
    defaultLifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime)
                          .value_or(VariableLifetime::Static);

    auto header = syntax.header.get();
    if (header->ports && header->ports->kind == SyntaxKind::WildcardPortList) {
        auto& comp = scope.getCompilation();
        auto externMod = comp.getExternDefinition(name, scope);
        if (externMod && externMod->kind == SyntaxKind::ExternModuleDecl)
            header = externMod->as<ExternModuleDeclSyntax>().header;
        else if (!name.empty())
            scope.addDiag(diag::MissingExternWildcardPorts, header->ports->sourceRange()) << name;
    }

    portList = header->ports;
    hasNonAnsiPorts = portList && portList->kind == SyntaxKind::NonAnsiPortList;

    // Find all port parameters.
    bool hasPortParams = header->parameters != nullptr;
    if (hasPortParams)
        ParameterBuilder::createDecls(scope, *header->parameters, parameters);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            if (!timeScale)
                timeScale.emplace();

            SemanticFacts::populateTimeScale(*timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;
        if (member->kind == SyntaxKind::ModportDeclaration) {
            for (auto item : member->as<ModportDeclarationSyntax>().items)
                modports.emplace(item->name.valueText());
        }
        else if (member->kind == SyntaxKind::ParameterDeclarationStatement) {
            auto declaration = member->as<ParameterDeclarationStatementSyntax>().parameter;
            bool isLocal = hasPortParams ||
                           declaration->keyword.kind == TokenKind::LocalParamKeyword;

            ParameterBuilder::createDecls(scope, *declaration, isLocal, /* isPort */ false,
                                          member->attributes, parameters);
        }
    }

    SemanticFacts::populateTimeScale(timeScale, scope, directiveTimeScale, unitsRange,
                                     precisionRange);
}